

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 HashmapCmpCallback4(jx9_hashmap_node *pA,jx9_hashmap_node *pB,void *pCmpData)

{
  sxi32 sVar1;
  jx9_value *pjVar2;
  sxi32 local_8c;
  jx9_value *pjStack_88;
  sxi32 rc;
  jx9_value *apArg [2];
  jx9_value *pV2;
  jx9_value *pV1;
  jx9_value *pCallback;
  jx9_value sResult;
  void *pCmpData_local;
  jx9_hashmap_node *pB_local;
  jx9_hashmap_node *pA_local;
  
  sResult._56_8_ = pCmpData;
  jx9MemObjInit(pA->pMap->pVm,(jx9_value *)&pCallback);
  pjVar2 = HashmapExtractNodeValue(pA);
  apArg[0] = HashmapExtractNodeValue(pB);
  pjStack_88 = pjVar2;
  apArg[1] = apArg[0];
  sVar1 = jx9VmCallUserFunction
                    (pA->pMap->pVm,(jx9_value *)pCmpData,2,&stack0xffffffffffffff78,
                     (jx9_value *)&pCallback);
  if (sVar1 == 0) {
    if ((sResult.x.iVal._0_4_ & 2) == 0) {
      jx9MemObjToInteger((jx9_value *)&pCallback);
    }
    local_8c = (sxi32)pCallback;
  }
  else {
    local_8c = -1;
  }
  jx9MemObjRelease((jx9_value *)&pCallback);
  return local_8c;
}

Assistant:

static sxi32 HashmapCmpCallback4(jx9_hashmap_node *pA, jx9_hashmap_node *pB, void *pCmpData)
{
	jx9_value sResult, *pCallback;
	jx9_value *pV1, *pV2;
	jx9_value *apArg[2];  /* Callback arguments */
	sxi32 rc;
	/* Point to the desired callback */
	pCallback = (jx9_value *)pCmpData;
	/* initialize the result value */
	jx9MemObjInit(pA->pMap->pVm, &sResult);
	/* Extract nodes values */
	pV1 = HashmapExtractNodeValue(pA);
	pV2 = HashmapExtractNodeValue(pB);
	apArg[0] = pV1;
	apArg[1] = pV2;
	/* Invoke the callback */
	rc = jx9VmCallUserFunction(pA->pMap->pVm, pCallback, 2, apArg, &sResult);
	if( rc != SXRET_OK ){
		/* An error occured while calling user defined function [i.e: not defined] */
		rc = -1; /* Set a dummy result */
	}else{
		/* Extract callback result */
		if((sResult.iFlags & MEMOBJ_INT) == 0 ){
			/* Perform an int cast */
			jx9MemObjToInteger(&sResult);
		}
		rc = (sxi32)sResult.x.iVal;
	}
	jx9MemObjRelease(&sResult);
	/* Callback result */
	return rc;
}